

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

int __thiscall
google::protobuf::RepeatedField<int>::SpaceUsedExcludingSelf(RepeatedField<int> *this)

{
  LogMessage *other;
  ulong uVar1;
  LogMessage local_60;
  LogFinisher local_21;
  
  uVar1 = 0;
  if (0 < (long)this->total_size_) {
    uVar1 = (long)this->total_size_ * 4 + 8;
  }
  if ((int)(uVar1 >> 0x1f) != 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/message_lite.h"
               ,0x6b);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (size) <= (static_cast<size_t>(2147483647)): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  return (int)uVar1;
}

Assistant:

int SpaceUsedExcludingSelf() const {
    return internal::ToIntSize(SpaceUsedExcludingSelfLong());
  }